

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O1

int32_t icu_63::UnicodeSet::matchRest
                  (Replaceable *text,int32_t start,int32_t limit,UnicodeString *s)

{
  short sVar1;
  int iVar2;
  uint uVar3;
  char16_t *pcVar4;
  uint uVar5;
  char16_t cVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  
  sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar7 = (s->fUnion).fFields.fLength;
  }
  else {
    uVar7 = (int)sVar1 >> 5;
  }
  if (start < limit) {
    uVar5 = limit - start;
    if ((int)uVar7 <= limit - start) {
      uVar5 = uVar7;
    }
    if (1 < (int)uVar5) {
      uVar8 = 1;
      do {
        iVar2 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)(uint)(start + (int)uVar8));
        sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
        uVar7 = (int)sVar1 >> 5;
        if (sVar1 < 0) {
          uVar7 = (s->fUnion).fFields.fLength;
        }
        cVar6 = L'\xffff';
        if (uVar8 < uVar7) {
          pcVar4 = (char16_t *)((long)&s->fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar4 = (s->fUnion).fFields.fArray;
          }
          cVar6 = pcVar4[uVar8];
        }
        if ((char16_t)iVar2 != cVar6) {
          return 0;
        }
        uVar8 = uVar8 + 1;
      } while (uVar5 != uVar8);
    }
  }
  else {
    uVar5 = start - limit;
    if ((int)uVar7 <= start - limit) {
      uVar5 = uVar7;
    }
    if (1 < (int)uVar5) {
      uVar7 = uVar7 - 2;
      uVar10 = start - 1;
      lVar9 = (ulong)uVar5 - 1;
      do {
        iVar2 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)uVar10);
        sVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar3 = (s->fUnion).fFields.fLength;
        }
        else {
          uVar3 = (int)sVar1 >> 5;
        }
        cVar6 = L'\xffff';
        if (uVar7 < uVar3) {
          pcVar4 = (char16_t *)((long)&s->fUnion + 2);
          if (((int)sVar1 & 2U) == 0) {
            pcVar4 = (s->fUnion).fFields.fArray;
          }
          cVar6 = pcVar4[(int)uVar7];
        }
        if ((char16_t)iVar2 != cVar6) {
          return 0;
        }
        uVar7 = uVar7 - 1;
        uVar10 = uVar10 - 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
  }
  return uVar5;
}

Assistant:

int32_t UnicodeSet::matchRest(const Replaceable& text,
                              int32_t start, int32_t limit,
                              const UnicodeString& s) {
    int32_t i;
    int32_t maxLen;
    int32_t slen = s.length();
    if (start < limit) {
        maxLen = limit - start;
        if (maxLen > slen) maxLen = slen;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start + i) != s.charAt(i)) return 0;
        }
    } else {
        maxLen = start - limit;
        if (maxLen > slen) maxLen = slen;
        --slen; // <=> slen = s.length() - 1;
        for (i = 1; i < maxLen; ++i) {
            if (text.charAt(start - i) != s.charAt(slen - i)) return 0;
        }
    }
    return maxLen;
}